

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f *st,Float *duv_dw)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar8 [64];
  float fVar9;
  Tuple3<pbrt::Vector3,_float> TVar10;
  Tuple3<pbrt::Vector3,_float> local_38;
  float local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined1 extraout_var [60];
  
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0xbfc90fdb),0),SUB6416(ZEXT464(0x40490fdb),0));
  auVar5 = vfmadd132ss_fma(SUB6416(ZEXT464(0x40490fdb),0),SUB6416(ZEXT464(0xbfc90fdb),0),
                           ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).y));
  local_28 = tanf(auVar6._0_4_);
  uStack_24 = extraout_XMM0_Db;
  uStack_20 = extraout_XMM0_Dc;
  uStack_1c = extraout_XMM0_Dd;
  auVar8._0_4_ = tanf(auVar5._0_4_);
  auVar8._4_60_ = extraout_var;
  auVar4._4_4_ = uStack_24;
  auVar4._0_4_ = local_28;
  auVar4._8_4_ = uStack_20;
  auVar4._12_4_ = uStack_1c;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar8._0_4_)),auVar4,auVar4);
  auVar6 = ZEXT416((uint)(auVar6._0_4_ + 1.0));
  auVar5 = vsqrtss_avx(auVar6,auVar6);
  auVar6 = vinsertps_avx(auVar8._0_16_,auVar4,0x10);
  fVar9 = auVar5._0_4_;
  auVar5._4_4_ = fVar9;
  auVar5._0_4_ = fVar9;
  auVar5._8_4_ = fVar9;
  auVar5._12_4_ = fVar9;
  auVar6 = vdivps_avx(auVar6,auVar5);
  auVar5 = vshufps_avx(auVar6,auVar6,0xe1);
  local_38._0_8_ = vmovlps_avx(auVar5);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)(-1.0 / fVar9)),ZEXT816(0) << 0x20,0);
  bVar2 = (bool)((byte)uVar1 & 1);
  local_38.z = (float)((uint)bVar2 * 0x3727c5ac + (uint)!bVar2 * (int)(-1.0 / fVar9));
  if (duv_dw != (Float *)0x0) {
    auVar3._8_4_ = 0x3f800000;
    auVar3._0_8_ = 0x3f8000003f800000;
    auVar3._12_4_ = 0x3f800000;
    auVar5 = vfnmadd213ps_avx512vl(auVar6,auVar6,auVar3);
    auVar6 = vmovshdup_avx(auVar5);
    auVar7._0_4_ = (auVar5._0_4_ * auVar6._0_4_) / local_38.z;
    auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar6._8_4_ = 0x7fffffff;
    auVar6._0_8_ = 0x7fffffff7fffffff;
    auVar6._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx512vl(auVar7,auVar6);
    *duv_dw = auVar6._0_4_ * 9.869605;
  }
  TVar10 = (Tuple3<pbrt::Vector3,_float>)Frame::FromLocal(&this->portalFrame,(Vector3f *)&local_38);
  return (Vector3f)TVar10;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(const Point2f &st, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + st.x * Pi, beta = -Pi / 2 + st.y * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, -1));

        if (w.z == 0)
            w.z = 1e-5;
        if (duv_dw)
            *duv_dw = Pi * Pi * std::abs((1 - w.y * w.y) * (1 - w.x * w.x) / w.z);
        return portalFrame.FromLocal(w);
    }